

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

void init_noise(void)

{
  uint uVar1;
  double dVar2;
  undefined1 local_30 [8];
  Vector rp;
  int k;
  int j;
  int i;
  
  Vector::Vector((Vector *)local_30);
  srand(0);
  hash_table = (int *)operator_new__(0x4000);
  for (k = 0; k < 0x1000; k = k + 1) {
    hash_table[k] = k;
  }
  for (k = 0xfff; 0 < k; k = k + -1) {
    dVar2 = rnd();
    rp.z._4_4_ = hash_table[k];
    hash_table[k] = hash_table[(int)(dVar2 * 4096.0)];
    hash_table[(int)(dVar2 * 4096.0)] = rp.z._4_4_;
  }
  noise_table = (double *)operator_new__(0x858);
  for (k = 0; k < 0x10b; k = k + 1) {
    Vector::operator=((Vector *)local_30,(double)k);
    uVar1 = R((Vector *)local_30);
    noise_table[k] = (double)uVar1 * 3.0518043793392844e-05 + -1.0;
  }
  return;
}

Assistant:

void init_noise()
{
   int   i, j, k;
   Vector rp;

   srand(0);
   //
   // Init hash table
   //
   hash_table = new int [4096];
   for( i = 0; i <   4096; i++ )
      hash_table[i] =   i;

   for( i = 4095; i > 0; i-- )
   {
      j =   (int)(rnd() * 4096.0);
      k =   hash_table[i];
      hash_table[i] =   hash_table[j];
      hash_table[j] =   k;
   }
   //
   // Init noise table
   //
   noise_table = new double [max_noise_size];

   for( i = 0; i <   max_noise_size;   i++   )
   {
      rp = (double)i;
      noise_table[i] = R(rp) * REALSCALE - 1.0;

#if   !defined(FINAL)
//    printf("NoiseTable[%d] == %g\n",i,NoiseTable[i]);
#endif

   }
}